

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxAssign::Resolve(FxAssign *this,FCompileContext *ctx)

{
  FxExpression *pFVar1;
  PType *pPVar2;
  PType *pPVar3;
  PStruct *this_00;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxTypeCast *this_01;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  PClass *pPVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *message;
  bool bVar7;
  bool writable;
  undefined1 local_21;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar1 = this->Base;
  if (pFVar1 != (FxExpression *)0x0) {
    iVar5 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx);
    this->Base = (FxExpression *)CONCAT44(extraout_var,iVar5);
  }
  if (this->Base == (FxExpression *)0x0) goto LAB_00526cea;
  (this->super_FxExpression).ValueType = this->Base->ValueType;
  pFVar1 = this->Right;
  if (pFVar1 != (FxExpression *)0x0) {
    iVar5 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx);
    this->Right = (FxExpression *)CONCAT44(extraout_var_00,iVar5);
  }
  if (this->Right == (FxExpression *)0x0) goto LAB_00526cea;
  if (((this->IsModifyAssign == true) && (this->Base->ValueType == (PType *)TypeBool)) &&
     (this->Right->ValueType != (PType *)TypeBool)) {
    message = "Invalid modify/assign operation with a boolean operand";
  }
  else {
    iVar5 = (*(this->Base->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
    if (((char)iVar5 == '\0') ||
       (iVar5 = (*(this->Right->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])(),
       (char)iVar5 == '\0')) {
      pPVar6 = PNativeStruct::RegistrationInfo.MyClass;
      pPVar4 = PArray::RegistrationInfo.MyClass;
      pPVar2 = this->Base->ValueType;
      pPVar3 = this->Right->ValueType;
      if (pPVar2 != pPVar3) {
        if ((pPVar3->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
          iVar5 = (**(pPVar3->super_PTypeBase).super_DObject._vptr_DObject)(pPVar3);
          (pPVar3->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar5);
        }
        pPVar4 = PPointer::RegistrationInfo.MyClass;
        if ((pPVar3->super_PTypeBase).super_DObject.Class == pPVar6) {
          pPVar2 = this->Base->ValueType;
          if ((pPVar2->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
            iVar5 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
            (pPVar2->super_PTypeBase).super_DObject.Class =
                 (PClass *)CONCAT44(extraout_var_02,iVar5);
          }
          pPVar6 = (pPVar2->super_PTypeBase).super_DObject.Class;
          bVar7 = pPVar6 != (PClass *)0x0;
          if (pPVar6 != pPVar4 && bVar7) {
            do {
              pPVar6 = pPVar6->ParentClass;
              bVar7 = pPVar6 != (PClass *)0x0;
              if (pPVar6 == pPVar4) break;
            } while (pPVar6 != (PClass *)0x0);
          }
          if ((bVar7) &&
             (pFVar1 = this->Right,
             (PType *)this->Base->ValueType[1].super_PTypeBase.super_DObject._vptr_DObject ==
             pFVar1->ValueType)) {
            (*pFVar1->_vptr_FxExpression[4])(pFVar1,ctx,&local_21);
            this->Right->ValueType = this->Base->ValueType;
            goto LAB_00526bdf;
          }
        }
        this_01 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
        FxTypeCast::FxTypeCast(this_01,this->Right,this->Base->ValueType,false,false);
        goto LAB_00526bc2;
      }
      if ((pPVar2->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(pPVar2->super_PTypeBase).super_DObject._vptr_DObject)(pPVar2);
        (pPVar2->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_04,iVar5);
      }
      pPVar6 = (pPVar2->super_PTypeBase).super_DObject.Class;
      bVar7 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar4 && bVar7) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar7 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar4) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (bVar7) {
        message = "Cannot assign arrays";
      }
      else {
        this_00 = (PStruct *)this->Base->ValueType;
        if (((this_00 == TypeVector2) || (this_00 == TypeVector3)) ||
           (bVar7 = DObject::IsKindOf((DObject *)this_00,PStruct::RegistrationInfo.MyClass), !bVar7)
           ) goto LAB_00526bdf;
        message = "Struct assignment not implemented yet";
      }
    }
    else {
      pPVar2 = (this->super_FxExpression).ValueType;
      if (this->Right->ValueType != pPVar2) {
        if (pPVar2 == (PType *)TypeBool) {
          this_01 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
          FxBoolCast::FxBoolCast((FxBoolCast *)this_01,this->Right,true);
        }
        else if (pPVar2->RegType == '\0') {
          this_01 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
          FxIntCast::FxIntCast((FxIntCast *)this_01,this->Right,ctx->FromDecorate,false);
        }
        else {
          this_01 = (FxTypeCast *)FMemArena::Alloc(&FxAlloc,0x30);
          FxFloatCast::FxFloatCast((FxFloatCast *)this_01,this->Right);
        }
LAB_00526bc2:
        this->Right = &this_01->super_FxExpression;
        iVar5 = (*(this_01->super_FxExpression)._vptr_FxExpression[2])(this_01,ctx);
        this->Right = (FxExpression *)CONCAT44(extraout_var_03,iVar5);
        if ((FxExpression *)CONCAT44(extraout_var_03,iVar5) == (FxExpression *)0x0)
        goto LAB_00526cea;
      }
LAB_00526bdf:
      iVar5 = (*this->Base->_vptr_FxExpression[4])(this->Base,ctx,&this->AddressWritable);
      if (((char)iVar5 != '\0') && (this->AddressWritable != false)) {
        iVar5 = (*this->Base->_vptr_FxExpression[8])();
        this->IsBitWrite = iVar5;
        return &this->super_FxExpression;
      }
      message = "Expression must be a modifiable value";
    }
  }
  FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message);
LAB_00526cea:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxAssign::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Base, ctx);

	ValueType = Base->ValueType;

	SAFE_RESOLVE(Right, ctx);

	if (IsModifyAssign && Base->ValueType == TypeBool && Right->ValueType != TypeBool)
	{
		// If the modify operation resulted in a type promotion from bool to int, this must be blocked.
		// (this means, for bool, only &=, ^= and |= are allowed, although DECORATE is more lax.)
		ScriptPosition.Message(MSG_ERROR, "Invalid modify/assign operation with a boolean operand");
		delete this;
		return nullptr;
	}

	// keep the redundant handling for numeric types here to avoid problems with DECORATE.
	// for non-numerics FxTypeCast can be used without issues.
	if (Base->IsNumeric() && Right->IsNumeric())
	{
		if (Right->ValueType != ValueType)
		{
			if (ValueType == TypeBool)
			{
				Right = new FxBoolCast(Right);
			}
			else if (ValueType->GetRegType() == REGT_INT)
			{
				Right = new FxIntCast(Right, ctx.FromDecorate);
			}
			else
			{
				Right = new FxFloatCast(Right);
			}
			SAFE_RESOLVE(Right, ctx);
		}
	}
	else if (Base->ValueType == Right->ValueType)
	{
		if (Base->ValueType->IsKindOf(RUNTIME_CLASS(PArray)))
		{
			ScriptPosition.Message(MSG_ERROR, "Cannot assign arrays");
			delete this;
			return nullptr;
		}
		if (!Base->IsVector() && Base->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			ScriptPosition.Message(MSG_ERROR, "Struct assignment not implemented yet");
			delete this;
			return nullptr;
		}
		// Both types are the same so this is ok.
	}
	else if (Right->ValueType->IsA(RUNTIME_CLASS(PNativeStruct)) && Base->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) && static_cast<PPointer*>(Base->ValueType)->PointedType == Right->ValueType)
	{
		// allow conversion of native structs to pointers of the same type. This is necessary to assign elements from global arrays like players, sectors, etc. to local pointers.
		// For all other types this is not needed. Structs are not assignable and classes can only exist as references.
		bool writable;
		Right->RequestAddress(ctx, &writable);
		Right->ValueType = Base->ValueType;
	}
	else
	{
		// pass it to FxTypeCast for complete handling.
		Right = new FxTypeCast(Right, Base->ValueType, false);
		SAFE_RESOLVE(Right, ctx);
	}

	if (!Base->RequestAddress(ctx, &AddressWritable) || !AddressWritable)
	{
		ScriptPosition.Message(MSG_ERROR, "Expression must be a modifiable value");
		delete this;
		return nullptr;
	}

	// Special case: Assignment to a bitfield.
	IsBitWrite = Base->GetBitValue();
	return this;
}